

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int LTnum(TValue *l,TValue *r)

{
  lua_Number lf;
  lua_Integer li;
  TValue *r_local;
  TValue *l_local;
  
  if (l->tt_ == '\x03') {
    if (r->tt_ == '\x03') {
      l_local._4_4_ = (uint)((l->value_).i < (r->value_).i);
    }
    else {
      l_local._4_4_ = LTintfloat((l->value_).i,(r->value_).n);
    }
  }
  else if (r->tt_ == '\x13') {
    l_local._4_4_ = (uint)((l->value_).n < (r->value_).n);
  }
  else {
    l_local._4_4_ = LTfloatint((l->value_).n,(r->value_).i);
  }
  return l_local._4_4_;
}

Assistant:

l_sinline int LTnum (const TValue *l, const TValue *r) {
  lua_assert(ttisnumber(l) && ttisnumber(r));
  if (ttisinteger(l)) {
    lua_Integer li = ivalue(l);
    if (ttisinteger(r))
      return li < ivalue(r);  /* both are integers */
    else  /* 'l' is int and 'r' is float */
      return LTintfloat(li, fltvalue(r));  /* l < r ? */
  }
  else {
    lua_Number lf = fltvalue(l);  /* 'l' must be float */
    if (ttisfloat(r))
      return luai_numlt(lf, fltvalue(r));  /* both are float */
    else  /* 'l' is float and 'r' is int */
      return LTfloatint(lf, ivalue(r));
  }
}